

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

bool __thiscall
pg::DTLSolver::computeDistanceValues
          (DTLSolver *this,bitset *V,bitset *R,bitset *G,int *val,int player)

{
  bitset *Z;
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  Game *pGVar4;
  int *piVar5;
  uint64_t *puVar6;
  size_t sVar7;
  byte bVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long local_78;
  int local_64;
  
  Z = &this->Z;
  local_64 = 1;
  do {
    bVar10 = bitset::any(V);
    if (!bVar10) {
      return false;
    }
    uVar17 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
    while( true ) {
      uVar17 = uVar17 - 1;
      uVar16 = (uint)uVar17;
      if ((int)uVar16 < 0) break;
      uVar15 = uVar16 & 0x7fffffff;
      uVar12 = uVar15 >> 6;
      if ((V->_bits[uVar12] >> (uVar17 & 0x3f) & 1) != 0) {
        uVar14 = 1L << (uVar17 & 0x3f);
        uVar20 = Z->_bits[uVar12];
        if ((uVar20 & uVar14) == 0) {
          Z->_bits[uVar12] = uVar20 | uVar14;
          this->str[uVar15] = -1;
          iVar19 = (this->Q).pointer;
          (this->Q).pointer = iVar19 + 1;
          (this->Q).queue[iVar19] = uVar16;
          while( true ) {
            iVar19 = (this->Q).pointer;
            if ((long)iVar19 == 0) break;
            (this->Q).pointer = iVar19 + -1;
            uVar2 = (this->Q).queue[(long)iVar19 + -1];
            attractVertices(this,player,uVar2,R,Z,G,((this->super_Solver).game)->_priority[uVar15]);
            attractTangles(this,player,uVar2,R,Z,G,((this->super_Solver).game)->_priority[uVar15]);
          }
        }
      }
    }
    local_78 = 0;
    uVar20 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
    uVar17 = 0;
    while( true ) {
      uVar20 = uVar20 - 1;
      uVar16 = (uint)uVar20;
      if ((int)uVar16 < 0) break;
      if (((V->_bits[uVar16 >> 6 & 0x1ffffff] >> (uVar20 & 0x3f) & 1) != 0) &&
         (bVar11 = attracts(this,player,uVar16,Z,G), !bVar11)) {
        local_78 = local_78 + 1;
        this->Candidates[uVar17] = uVar16;
        uVar17 = (ulong)((int)uVar17 + 1);
      }
    }
    if ((int)uVar17 == 0) {
      uVar17 = ((this->super_Solver).game)->n_vertices;
      puVar6 = V->_bits;
      for (uVar20 = 0; (~((long)uVar17 >> 0x3f) & uVar17) != uVar20; uVar20 = uVar20 + 1) {
        if ((puVar6[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0) {
          val[uVar20] = 0x7fffffff;
        }
      }
      puVar6 = (this->Z)._bits;
      sVar7 = (this->Z)._bitssize;
      for (lVar18 = 0; sVar7 << 3 != lVar18; lVar18 = lVar18 + 8) {
        *(undefined8 *)((long)puVar6 + lVar18) = 0;
      }
      return true;
    }
    lVar18 = 0;
    iVar19 = 0;
LAB_001640a2:
    uVar17 = (ulong)(int)lVar18;
LAB_001640aa:
    uVar20 = uVar17 >> 6;
    uVar14 = 1L << (uVar17 & 0x3f);
LAB_001640cb:
    pGVar4 = (this->super_Solver).game;
    if ((long)uVar17 <= pGVar4->n_vertices) {
      if (pGVar4->n_vertices == uVar17) {
        iVar13 = (this->Q).pointer;
        if (iVar13 == 0) goto LAB_001642b3;
      }
      else {
        if (((R->_bits[uVar20] & uVar14) == 0) || ((Z->_bits[uVar20] & uVar14) != 0)) break;
        iVar3 = pGVar4->_priority[uVar17];
        iVar13 = (this->Q).pointer;
        if ((iVar3 <= iVar19) || (iVar13 == 0)) {
          iVar9 = iVar19;
          if (iVar13 == 0) {
            iVar9 = iVar3;
          }
          if (iVar3 <= iVar19) {
            iVar9 = iVar19;
          }
          bVar11 = attracts(this,player,(uint)uVar17,Z,G);
          if (bVar11) {
            puVar1 = (this->Z)._bits + uVar20;
            *puVar1 = *puVar1 | uVar14;
            iVar19 = (this->Q).pointer;
            (this->Q).pointer = iVar19 + 1;
            (this->Q).queue[iVar19] = (uint)uVar17;
          }
          lVar18 = uVar17 + 1;
          iVar19 = iVar9;
          goto LAB_001640a2;
        }
      }
      while (iVar13 != 0) {
        (this->Q).pointer = iVar13 + -1;
        uVar2 = (this->Q).queue[(long)iVar13 + -1];
        attractVertices(this,player,uVar2,R,Z,G,iVar19);
        attractTangles(this,player,uVar2,R,Z,G,iVar19);
        iVar13 = (this->Q).pointer;
      }
      lVar21 = 0;
      lVar18 = local_78;
      while (bVar11 = lVar18 != 0, lVar18 = lVar18 + -1, bVar11) {
        iVar13 = *(int *)((long)this->Candidates + lVar21);
        if ((long)iVar13 != -1) {
          if (((this->super_Solver).game)->_priority[iVar13] <= iVar19) break;
          bVar11 = attracts(this,player,iVar13,Z,G);
          if (bVar11) {
            *(undefined4 *)((long)this->Candidates + lVar21) = 0xffffffff;
          }
        }
        lVar21 = lVar21 + 4;
      }
      goto LAB_001640cb;
    }
LAB_001642b3:
    bVar11 = false;
    piVar5 = this->Candidates;
    puVar6 = V->_bits;
    for (lVar18 = 0; local_78 != lVar18; lVar18 = lVar18 + 1) {
      iVar19 = piVar5[lVar18];
      uVar17 = (ulong)iVar19;
      if (uVar17 != 0xffffffffffffffff) {
        val[uVar17] = local_64;
        bVar8 = (byte)iVar19 & 0x3f;
        puVar6[uVar17 >> 6] =
             puVar6[uVar17 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        bVar11 = true;
      }
    }
    puVar6 = (this->Z)._bits;
    sVar7 = (this->Z)._bitssize;
    for (lVar18 = 0; sVar7 << 3 != lVar18; lVar18 = lVar18 + 8) {
      *(undefined8 *)((long)puVar6 + lVar18) = 0;
    }
    local_64 = local_64 + 1;
    if (!bVar11) {
      uVar17 = pGVar4->n_vertices;
      puVar6 = V->_bits;
      for (uVar20 = 0; (~((long)uVar17 >> 0x3f) & uVar17) != uVar20; uVar20 = uVar20 + 1) {
        if ((puVar6[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0) {
          val[uVar20] = 0x7fffffff;
        }
      }
      return bVar10;
    }
  } while( true );
  uVar17 = uVar17 + 1;
  goto LAB_001640aa;
}

Assistant:

bool
DTLSolver::computeDistanceValues(bitset &V, bitset &R, bitset &G, int* val, const int player)
{
    int dist = 1; // start distance 1

    while (V.any()) {
        // make the partition (attract lower to higher)
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                Z[top] = true;
                str[top] = -1; // avoid valgrind warnings...
                Q.push(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(player, v, R, Z, G, priority(top));
                    attractTangles(player, v, R, Z, G, priority(top));
                }
            }
        }

        // find candidate vertices to remove from V
        int n_candidates = 0;

        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, G)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            Z.reset();
            return true;
        }

        // attract higher to lower
        int t = 0;
        for (int v=0; v<=nodecount();) {
            if (v == nodecount()) {
                if (Q.empty()) break;
            } else if (!R[v] or Z[v]) {
                v++;
                continue; // only attract vertices in <R\Z>
            } else {
                if (priority(v) > t and Q.empty()) t = priority(v);
                if (priority(v) <= t) {
                    if (attracts(player, v, Z, G)) {
                        Z[v] = true;
                        Q.push(v);
                    }
                    v++;
                    continue;
                } 
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, G, t);
                attractTangles(player, u, R, Z, G, t);
            }

            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u == -1) continue;
                if (priority(u) <= t) break; // stop checking once we are below the threshold
                if (attracts(player, u, Z, G)) Candidates[x] = -1;
            }
        }

        // remaining Candidates have no path from high to low, remove them from V

        bool V_changed = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            val[u] = dist;
            V[u] = false;
            V_changed = true;
        }

        Z.reset();
        dist++;

        if (!V_changed) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            return true;
        }
    }

    return false;
}